

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_RepeatedFieldMoveCtorOnArena_Test::
~ArenaTest_RepeatedFieldMoveCtorOnArena_Test(ArenaTest_RepeatedFieldMoveCtorOnArena_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedFieldMoveCtorOnArena) {
  Arena arena;

  auto* original = Arena::Create<RepeatedField<int32_t>>(&arena);
  original->Add(1);
  original->Add(2);
  ASSERT_EQ(original->size(), 2);
  ASSERT_EQ(original->Get(0), 1);
  ASSERT_EQ(original->Get(1), 2);

  auto* moved =
      Arena::Create<RepeatedField<int32_t>>(&arena, std::move(*original));

  EXPECT_EQ(moved->size(), 2);
  EXPECT_EQ(moved->Get(0), 1);
  EXPECT_EQ(moved->Get(1), 2);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}